

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O2

size_type __thiscall mserialize::string_view::find(string_view *this,string_view s,size_type pos)

{
  const_iterator pcVar1;
  size_type sVar2;
  
  sVar2 = 0xffffffffffffffff;
  if ((pos <= this->_len) && (sVar2 = pos, s._len != 0)) {
    pcVar1 = search(this->_ptr + pos,this->_ptr + this->_len,s._ptr,s._ptr + s._len);
    sVar2 = 0xffffffffffffffff;
    if (pcVar1 != this->_ptr + this->_len) {
      sVar2 = (long)pcVar1 - (long)this->_ptr;
    }
  }
  return sVar2;
}

Assistant:

size_type find(string_view s, size_type pos = 0) const noexcept
  {
    if (pos > size()) { return npos; }
    if (s.empty()) { return pos; }
    const_iterator iter = search(cbegin() + pos, cend(), s.cbegin(), s.cend());
    return iter == cend() ? npos : size_type(iter - cbegin());
  }